

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_allocator.cpp
# Opt level: O2

BufferHandle * __thiscall
duckdb::TupleDataAllocator::PinHeapBlock
          (TupleDataAllocator *this,TupleDataPinState *pin_state,TupleDataChunkPart *part)

{
  iterator iVar1;
  uint32_t *id;
  pair<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,_duckdb::BufferHandle>_*,_std::vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>_>,_bool>
  pVar2;
  BufferHandle local_40;
  
  id = &part->heap_block_index;
  iVar1 = buffer_handle_map_t::find(&pin_state->heap_handles,id);
  if (iVar1._M_current ==
      (pin_state->heap_handles).handles.
      super_vector<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
      .
      super__Vector_base<std::pair<unsigned_int,_duckdb::BufferHandle>,_std::allocator<std::pair<unsigned_int,_duckdb::BufferHandle>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (*this->buffer_manager->_vptr_BufferManager[7])
              (&local_40,this->buffer_manager,
               (this->heap_blocks).
               super_vector<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
               super__Vector_base<duckdb::TupleDataBlock,_std::allocator<duckdb::TupleDataBlock>_>.
               _M_impl.super__Vector_impl_data._M_start + *id);
    pVar2 = buffer_handle_map_t::emplace(&pin_state->heap_handles,id,&local_40);
    iVar1._M_current = (pair<unsigned_int,_duckdb::BufferHandle> *)pVar2.first._M_current;
    BufferHandle::~BufferHandle(&local_40);
  }
  return &(iVar1._M_current)->second;
}

Assistant:

BufferHandle &TupleDataAllocator::PinHeapBlock(TupleDataPinState &pin_state, const TupleDataChunkPart &part) {
	const auto &heap_block_index = part.heap_block_index;
	auto it = pin_state.heap_handles.find(heap_block_index);
	if (it == pin_state.heap_handles.end()) {
		D_ASSERT(heap_block_index < heap_blocks.size());
		auto &heap_block = heap_blocks[heap_block_index];
		D_ASSERT(heap_block.handle);
		D_ASSERT(part.heap_block_offset < heap_block.size);
		D_ASSERT(part.heap_block_offset + part.total_heap_size <= heap_block.size);
		it = pin_state.heap_handles.emplace(heap_block_index, buffer_manager.Pin(heap_block.handle)).first;
	}
	return it->second;
}